

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcDataStream::~CTcDataStream(CTcDataStream *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  size_t i;
  ulong local_10;
  
  *in_RDI = &PTR__CTcDataStream_0042f808;
  for (local_10 = 0; local_10 < (ulong)in_RDI[8]; local_10 = local_10 + 1) {
    free(*(void **)(in_RDI[6] + local_10 * 8));
  }
  if (in_RDI[6] != 0) {
    free((void *)in_RDI[6]);
  }
  pvVar1 = (void *)in_RDI[0xb];
  if (pvVar1 != (void *)0x0) {
    CTcPrsMem::~CTcPrsMem((CTcPrsMem *)0x29cc39);
    operator_delete(pvVar1,0x20);
  }
  return;
}

Assistant:

CTcDataStream::~CTcDataStream()
{
    size_t i;

    /* delete the page slots if we allocated any */
    for (i = 0 ; i < page_cnt_ ; ++i)
        t3free(pages_[i]);

    /* delete the page slot array if we allocated it */
    if (pages_ != 0)
        t3free(pages_);

    /* delete our label/fixup allocator */
    delete allocator_;
}